

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int b64_ntop(uchar *src,size_t srclength,char *target,size_t targsize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  byte local_33 [3];
  
  sVar8 = 0;
  iVar4 = -1;
  uVar7 = 0;
  for (sVar9 = srclength; 2 < sVar9; sVar9 = sVar9 - 3) {
    if (targsize < uVar7 + 4) {
      return -1;
    }
    bVar1 = src[sVar8 + 2];
    bVar2 = src[sVar8 + 1];
    bVar3 = src[sVar8];
    target[uVar7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 >> 2];
    target[uVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(bVar3 & 3) << 4 | (uint)(bVar2 >> 4)];
    target[uVar7 + 2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
    target[uVar7 + 3] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
    sVar8 = sVar8 + 3;
    uVar7 = uVar7 + 4;
  }
  if (srclength != sVar8) {
    local_33[2] = 0;
    local_33[0] = 0;
    local_33[1] = 0;
    for (uVar5 = 0; sVar9 != uVar5; uVar5 = uVar5 + 1) {
      local_33[uVar5] = src[sVar8 + uVar5];
    }
    if (targsize < uVar7 + 4) {
      return -1;
    }
    target[uVar7] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_33[0] >> 2];
    target[uVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(local_33[0] & 3) << 4 | (uint)(local_33[1] >> 4)];
    cVar6 = '=';
    if (srclength - 1 != sVar8) {
      cVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(uint)(local_33[2] >> 6) + (local_33[1] & 0xf) * 4];
    }
    target[uVar7 + 2] = cVar6;
    target[uVar7 + 3] = '=';
    uVar7 = uVar7 + 4;
  }
  if (uVar7 < targsize) {
    target[uVar7] = '\0';
    iVar4 = (int)uVar7;
  }
  return iVar4;
}

Assistant:

int
b64_ntop(unsigned char const *src, size_t srclength, char *target, size_t targsize) {
	size_t datalength = 0;
	unsigned char input[3];
	unsigned char output[4];
	size_t i;

	while (2 < srclength) {
		input[0] = *src++;
		input[1] = *src++;
		input[2] = *src++;
		srclength -= 3;

		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		output[3] = input[2] & 0x3f;
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);
		Assert(output[3] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		target[datalength++] = Base64[output[2]];
		target[datalength++] = Base64[output[3]];
	}

	/* Now we worry about padding. */
	if (0 != srclength) {
		/* Get what's left. */
		input[0] = input[1] = input[2] = '\0';
		for (i = 0; i < srclength; i++)
			input[i] = *src++;
	
		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		if (srclength == 1)
			target[datalength++] = Pad64;
		else
			target[datalength++] = Base64[output[2]];
		target[datalength++] = Pad64;
	}
	if (datalength >= targsize)
		return (-1);
	target[datalength] = '\0';	/* Returned value doesn't count \0. */
	return (datalength);
}